

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O1

void __thiscall asmjit::v1_14::ZoneBitVector::release(ZoneBitVector *this,ZoneAllocator *allocator)

{
  uint *puVar1;
  int *piVar2;
  ZoneAllocator *pZVar3;
  byte bVar4;
  undefined8 *puVar5;
  Error EVar6;
  undefined1 *puVar7;
  uint uVar8;
  undefined8 *in_RCX;
  uint *puVar9;
  long *plVar10;
  uint *puVar11;
  uint uVar12;
  undefined4 extraout_EDX;
  undefined8 *extraout_RDX;
  uint *puVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ZoneVectorBase *unaff_RBX;
  uint uVar18;
  ulong unaff_RBP;
  ulong uVar19;
  uint *puVar20;
  long *plVar21;
  ZoneAllocator *allocator_00;
  ulong uVar22;
  uint *puVar23;
  ZoneAllocator *this_00;
  ZoneAllocator *pZVar24;
  undefined2 uVar25;
  uint *in_R8;
  uint *puVar26;
  long *plVar27;
  ZoneAllocator *pZVar28;
  int iVar29;
  long *plVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  char cVar34;
  long *plVar35;
  long *plVar36;
  ZoneVectorBase *this_01;
  bool bVar37;
  bool bVar38;
  char cVar39;
  ulong auStack_4d8 [2];
  ZoneVectorBase ZStack_4c8;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  uint *puStack_c0;
  ulong uStack_b8;
  size_t sStack_88;
  ZoneVectorBase *pZStack_80;
  undefined8 *puStack_68;
  code *pcStack_60;
  uint *puStack_58;
  code *pcStack_50;
  ZoneVectorBase *pZStack_48;
  
  puVar5 = *(undefined8 **)this;
  if (puVar5 == (undefined8 *)0x0) {
    return;
  }
  if (*(long *)allocator == 0) {
    release();
  }
  else {
    uVar12 = *(uint *)(this + 0xc);
    in_RCX = (undefined8 *)(ulong)uVar12;
    unaff_RBX = (ZoneVectorBase *)this;
    if (7 < uVar12) {
      uVar31 = (ulong)(uVar12 >> 3);
      if (uVar12 < 0x1008) {
        if (uVar12 < 0x408) {
          uVar22 = uVar31 + 0x1fffffffff >> 5;
        }
        else {
          uVar22 = (uVar31 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar22 = 0;
      }
      if (uVar12 < 0x1008) {
        *puVar5 = *(undefined8 *)(allocator + (uVar22 & 0xffffffff) * 8 + 8);
        *(undefined8 **)(allocator + (uVar22 & 0xffffffff) * 8 + 8) = puVar5;
      }
      else {
        ZoneAllocator::_releaseDynamic(allocator,puVar5,uVar31);
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      return;
    }
  }
  release();
  if (((ZoneVectorBase *)this)->_data == (void *)0x0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_0012abd0:
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar14 = *(long *)&((ZoneVectorBase *)this)->_size;
    in_RCX = *(undefined8 **)(lVar14 + 0x10);
    if (in_RCX == *(undefined8 **)((long)((ZoneVectorBase *)((long)this + 0x10))->_data + 0x18))
    goto LAB_0012abd0;
    if (in_RCX != *(undefined8 **)(lVar14 + 0x18)) {
      *(undefined8 **)(lVar14 + 0x10) = in_RCX + 1;
      if (in_RCX + 1 == *(undefined8 **)(lVar14 + 0x18)) {
        ZoneStackBase::_cleanupBlock((ZoneStackBase *)this,0,0x110);
      }
      return;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  puVar5 = (undefined8 *)((ZoneVectorBase *)this)->_data;
  if (puVar5 == (undefined8 *)0x0) {
    return;
  }
  if (*(long *)allocator == 0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar12 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar31 = (ulong)uVar12;
    unaff_RBX = (ZoneVectorBase *)this;
    if (uVar31 != 0) {
      if (uVar12 < 0x201) {
        if (uVar12 < 0x81) {
          uVar8 = (uint)(uVar31 + 0x1fffffffff >> 5);
        }
        else {
          uVar8 = (int)(uVar31 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar8 = 0;
      }
      if (uVar12 < 0x201) {
        *puVar5 = *(undefined8 *)(allocator + (ulong)uVar8 * 8 + 8);
        *(undefined8 **)(allocator + (ulong)uVar8 * 8 + 8) = puVar5;
      }
      else {
        ZoneAllocator::_releaseDynamic(allocator,puVar5,uVar31);
      }
      ((ZoneVectorBase *)this)->_data = (void *)0x0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      return;
    }
  }
  ZoneVector<unsigned_int>::release();
  if (allocator < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return;
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  EVar6 = 0;
  pZStack_48 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity <
      (uint)(*(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1))) {
    pcStack_50 = (code *)0x12ade5;
    EVar6 = ZoneVectorBase::_growingReserve
                      ((ZoneVectorBase *)this,allocator,0xc,
                       *(int *)(in_RCX + 1) + *(int *)(extraout_RDX + 1));
  }
  if (EVar6 != 0) {
    return;
  }
  puVar9 = (uint *)((ZoneVectorBase *)this)->_data;
  puVar26 = (uint *)*extraout_RDX;
  puVar13 = (uint *)*in_RCX;
  puVar11 = puVar26 + (ulong)*(uint *)(extraout_RDX + 1) * 3;
  puVar20 = puVar13 + (ulong)*(uint *)(in_RCX + 1) * 3;
  puVar23 = puVar9;
  if ((ulong)*(uint *)(in_RCX + 1) != 0 && (ulong)*(uint *)(extraout_RDX + 1) != 0) {
    uVar12 = *puVar26;
    do {
      while (uVar8 = puVar13[1], uVar12 < uVar8) {
        uVar12 = *puVar13;
        while( true ) {
          uVar8 = puVar26[1];
          unaff_RBP = (ulong)uVar8;
          if (uVar12 < uVar8) break;
          puVar1 = puVar23 + 3;
          in_RCX = (undefined8 *)(ulong)*puVar26;
          *puVar23 = *puVar26;
          puVar23[1] = uVar8;
          unaff_RBP = (ulong)puVar26[2];
          puVar23[2] = puVar26[2];
          puVar26 = puVar26 + 3;
          puVar23 = puVar1;
          if (puVar26 == puVar11) {
            bVar37 = true;
            goto LAB_0012ad68;
          }
        }
        uVar12 = *puVar26;
        if (uVar12 < puVar13[1]) {
          bVar37 = false;
          goto LAB_0012ad68;
        }
      }
      unaff_RBP = (ulong)*puVar13;
      *puVar23 = *puVar13;
      puVar23[1] = uVar8;
      puVar23[2] = *in_R8;
      puVar23 = puVar23 + 3;
      puVar13 = puVar13 + 3;
    } while (puVar13 != puVar20);
    bVar37 = true;
LAB_0012ad68:
    if (!bVar37) {
      return;
    }
  }
  for (; puVar26 != puVar11; puVar26 = puVar26 + 3) {
    *(undefined8 *)puVar23 = *(undefined8 *)puVar26;
    puVar23[2] = puVar26[2];
    puVar23 = puVar23 + 3;
  }
  for (; puVar13 != puVar20; puVar13 = puVar13 + 3) {
    *(undefined8 *)puVar23 = *(undefined8 *)puVar13;
    puVar23[2] = *in_R8;
    puVar23 = puVar23 + 3;
  }
  if ((puVar23 < puVar9) || (puVar9 + (ulong)((ZoneVectorBase *)this)->_capacity * 3 < puVar23)) {
    pcStack_50 = (code *)0x12adef;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar12 = (uint)puVar9;
  }
  else {
    puVar23 = (uint *)((ulong)((long)puVar23 - (long)puVar9) >> 2);
    uVar12 = (int)puVar23 * -0x55555555;
    if (uVar12 <= ((ZoneVectorBase *)this)->_capacity) {
      ((ZoneVectorBase *)this)->_size = uVar12;
      return;
    }
  }
  uVar25 = SUB82(puVar26,0);
  pcStack_50 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
  pcStack_50 = (code *)(ulong)puVar23[2];
  if (puVar20 < pcStack_50) {
    return;
  }
  puStack_58 = (uint *)0x12ae0d;
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  puStack_58 = (uint *)(ulong)puVar23[2];
  if (puVar20 < puStack_58) {
    return;
  }
  pcStack_60 = RAStackAllocator::newSlot;
  ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
  pZStack_80 = (ZoneVectorBase *)this;
  puStack_68 = in_RCX;
  pcStack_60 = (code *)unaff_RBP;
  if ((puVar23[9] != puVar23[8]) ||
     (EVar6 = ZoneVectorBase::_grow((ZoneVectorBase *)(puVar23 + 6),*(ZoneAllocator **)puVar23,8,1),
     EVar6 == 0)) {
    this_00 = *(ZoneAllocator **)puVar23;
    if (*(long *)this_00 == 0) {
      RAStackAllocator::newSlot();
LAB_0012aedb:
      RAStackAllocator::newSlot();
      uStack_b8 = (ulong)puVar20 & 0xffffffff;
      puStack_c0 = puVar23;
      plVar10 = *(long **)(this_00 + 0x18);
      uVar31 = (ulong)*(uint *)(this_00 + 0x20);
      if (uVar31 != 0) {
        plVar21 = (long *)0x0;
        do {
          lVar14 = *(long *)((long)plVar10 + (long)plVar21);
          bVar4 = *(byte *)(lVar14 + 1);
          if (bVar4 == 0) goto LAB_0012b353;
          uVar12 = 0;
          if (bVar4 != 0) {
            for (; (bVar4 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar8 = 6;
          if ((char)uVar12 != '\a') {
            uVar8 = uVar12;
          }
          if ((*(byte *)(lVar14 + 2) & 1) == 0) {
            uVar22 = (ulong)(uVar8 & 0xff);
          }
          else {
            uVar22 = (ulong)(byte)((byte)uVar8 ^ 7) * (ulong)*(uint *)(lVar14 + 8) + 0x10;
          }
          if (0xfffffffe < uVar22) {
            uVar22 = 0xffffffff;
          }
          *(int *)(lVar14 + 0xc) = (int)uVar22;
          plVar21 = plVar21 + 1;
        } while (uVar31 * 8 - (long)plVar21 != 0);
      }
      plVar21 = plVar10 + uVar31;
      lVar14 = 0;
LAB_0012af74:
      uVar22 = (long)plVar21 - (long)plVar10 >> 3;
      if (7 < uVar22) {
        plVar36 = plVar10 + 1;
        plVar27 = plVar21 + -1;
        lVar15 = *(long *)((long)plVar10 + (uVar22 & 0xfffffffffffffffe) * 4);
        *(long *)((long)plVar10 + (uVar22 & 0xfffffffffffffffe) * 4) = *plVar10;
        *plVar10 = lVar15;
        lVar15 = plVar10[1];
        if (*(uint *)(plVar21[-1] + 0xc) < *(uint *)(lVar15 + 0xc)) {
          *plVar36 = plVar21[-1];
          *plVar27 = lVar15;
        }
        lVar15 = *plVar10;
        if (*(uint *)(*plVar27 + 0xc) < *(uint *)(lVar15 + 0xc)) {
          *plVar10 = *plVar27;
          *plVar27 = lVar15;
        }
        lVar15 = plVar10[1];
        if (*(uint *)(*plVar10 + 0xc) < *(uint *)(lVar15 + 0xc)) {
          plVar10[1] = *plVar10;
          *plVar10 = lVar15;
        }
LAB_0012aff6:
        if (plVar36 < plVar27) goto code_r0x0012affb;
        goto LAB_0012b010;
      }
      if ((plVar10 != plVar21) && (1 < (long)uVar22)) {
        plVar36 = plVar10 + 1;
        plVar27 = plVar36;
joined_r0x0012b098:
        do {
          if (plVar10 < plVar36) {
            lVar15 = plVar36[-1];
            if (*(uint *)(*plVar36 + 0xc) < *(uint *)(lVar15 + 0xc)) {
              plVar36[-1] = *plVar36;
              *plVar36 = lVar15;
              plVar36 = plVar36 + -1;
              goto joined_r0x0012b098;
            }
          }
          plVar36 = plVar27 + 1;
          plVar27 = plVar36;
        } while (plVar36 < (long *)(((long)plVar21 - (long)plVar10) + (long)plVar10));
      }
      if (lVar14 != 0) {
        plVar10 = *(long **)((long)auStack_4d8 + lVar14);
        plVar21 = *(long **)((long)auStack_4d8 + lVar14 + 8);
        lVar14 = lVar14 + -0x10;
        goto LAB_0012af74;
      }
      uStack_478 = 0;
      uStack_470 = 0;
      uStack_488 = 0;
      uStack_480 = 0;
      uStack_498 = 0;
      uStack_490 = 0;
      uStack_4a8 = 0;
      uStack_4a0 = 0;
      uStack_4b8 = 0;
      uStack_4b0 = 0;
      ZStack_4c8._data = (void *)0x0;
      ZStack_4c8._size = 0;
      ZStack_4c8._capacity = 0;
      bVar37 = uVar31 == 0;
      if (bVar37) {
        iVar29 = -1;
      }
      else {
        pZVar28 = *(ZoneAllocator **)(this_00 + 0x18);
        pZVar3 = pZVar28 + uVar31 * 8;
        uVar31 = 0;
        do {
          lVar14 = *(long *)pZVar28;
          cVar34 = '\a';
          if ((*(byte *)(lVar14 + 2) & 2) == 0) {
            bVar4 = *(byte *)(lVar14 + 1);
            uVar12 = *(uint *)(lVar14 + 4);
            allocator_00 = (ZoneAllocator *)(ulong)uVar12;
            iVar29 = 0;
            if (uVar12 < 0x40) {
              uVar8 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              puVar11 = (uint *)((long)&ZStack_4c8._size + (ulong)(uVar8 << 4));
              lVar15 = 0;
              if ((ulong)uVar8 < 6) {
                lVar15 = 5 - (ulong)uVar8;
              }
              lVar15 = lVar15 + 1;
              do {
                bVar38 = *puVar11 != 0;
                if (bVar38) {
                  uVar8 = *puVar11 - 1;
                  pZVar24 = (ZoneAllocator *)(ulong)uVar8;
                  *puVar11 = uVar8;
                  uVar8 = *(uint *)(*(long *)(puVar11 + -2) + (long)pZVar24 * 8);
                  if (uVar8 % (uint)bVar4 != 0) goto LAB_0012b35d;
                  iVar29 = *(int *)(*(long *)(puVar11 + -2) + 4 + (long)pZVar24 * 8);
                  *(uint *)(lVar14 + 0x10) = uVar8;
                  iVar29 = iVar29 - uVar12;
                  uVar22 = (ulong)(uVar8 - uVar12);
                  goto LAB_0012b1c7;
                }
                puVar11 = puVar11 + 4;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
              uVar22 = 0;
            }
            else {
              bVar38 = false;
              uVar22 = 0;
            }
LAB_0012b1c7:
            auStack_4d8[1] = (ulong)bVar4;
            uVar8 = -(uint)bVar4 & ((int)uVar31 + (uint)bVar4) - 1;
            iVar16 = uVar8 - (int)uVar31;
            iVar17 = iVar16;
            if (iVar16 == 0 || bVar38) {
              iVar17 = iVar29;
            }
            uVar31 = uVar31 & 0xffffffff;
            if (!bVar38) {
              uVar31 = (ulong)uVar8;
            }
            if (iVar17 != 0) {
              uVar19 = (ulong)uVar8;
              if (iVar16 == 0 || bVar38) {
                uVar19 = uVar22;
              }
              uVar8 = iVar17 + (int)uVar19;
              do {
                uVar12 = (uint)allocator_00;
                uVar18 = (uint)uVar19;
                cVar34 = '\0';
                if (uVar8 <= uVar18) goto LAB_0012b2cf;
                iVar29 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> iVar29 & 1) == 0; iVar29 = iVar29 + 1) {
                  }
                }
                uVar12 = 1 << ((byte)iVar29 & 0x1f);
                cVar39 = '\r';
                if (uVar12 <= uVar8 - uVar18) {
                  uVar22 = (ulong)(uint)(iVar29 << 4);
                  this_01 = (ZoneVectorBase *)((long)&ZStack_4c8._data + uVar22);
                  if (*(int *)((long)&ZStack_4c8._size + uVar22) ==
                      *(int *)((long)&ZStack_4c8._capacity + uVar22)) {
                    allocator_00 = *(ZoneAllocator **)this_00;
                    auStack_4d8[0] = uVar31;
                    EVar6 = ZoneVectorBase::_grow(this_01,allocator_00,8,1);
                    uVar31 = auStack_4d8[0];
                    if (EVar6 == 0) goto LAB_0012b235;
                  }
                  else {
LAB_0012b235:
                    allocator_00 = (ZoneAllocator *)(uVar19 | (ulong)uVar12 << 0x20);
                    *(ZoneAllocator **)
                     ((long)this_01->_data + (ulong)*(uint *)((long)&ZStack_4c8._size + uVar22) * 8)
                         = allocator_00;
                    piVar2 = (int *)((long)&ZStack_4c8._size + uVar22);
                    *piVar2 = *piVar2 + 1;
                    EVar6 = 0;
                  }
                  cVar39 = EVar6 != 0;
                  if ((bool)cVar39) {
                    uVar12 = 0;
                  }
                  uVar19 = (ulong)(uVar12 + uVar18);
                }
                uVar12 = (uint)allocator_00;
              } while (cVar39 == '\0');
              cVar34 = '\0';
              if (cVar39 != '\r') {
                cVar34 = cVar39;
              }
LAB_0012b2cf:
              if (cVar34 != '\0') goto LAB_0012b2f6;
            }
            cVar34 = '\0';
            if (!bVar38) {
              pZVar24 = pZVar3;
              if ((int)((uVar31 & 0xffffffff) % (auStack_4d8[1] & 0xffffffff)) != 0)
              goto LAB_0012b358;
              *(int *)(lVar14 + 0x10) = (int)uVar31;
              uVar31 = (ulong)(uint)((int)uVar31 + *(int *)(lVar14 + 4));
            }
          }
LAB_0012b2f6:
          if ((cVar34 != '\a') && (cVar34 != '\0')) break;
          pZVar28 = pZVar28 + 8;
          bVar37 = pZVar28 == pZVar3;
        } while (!bVar37);
        iVar29 = (int)uVar31 + -1;
      }
      if (bVar37) {
        *(int *)(this_00 + 0xc) = -*(int *)(this_00 + 0x10) & iVar29 + *(int *)(this_00 + 0x10);
      }
      return;
    }
    puVar7 = (undefined1 *)ZoneAllocator::_alloc(this_00,0x14,&sStack_88);
    if (puVar7 != (undefined1 *)0x0) {
      *puVar7 = (char)((ulong)puVar20 & 0xffffffff);
      puVar7[1] = (char)uVar12 + (uVar12 == 0);
      *(undefined2 *)(puVar7 + 2) = uVar25;
      *(undefined4 *)(puVar7 + 8) = 0;
      *(undefined4 *)(puVar7 + 4) = extraout_EDX;
      *(undefined8 *)(puVar7 + 0xc) = 0;
      if (uVar12 < puVar23[4]) {
        uVar12 = puVar23[4];
      }
      puVar23[4] = uVar12;
      if (puVar23[9] <= puVar23[8]) goto LAB_0012aedb;
      *(undefined1 **)(*(long *)(puVar23 + 6) + (ulong)puVar23[8] * 8) = puVar7;
      puVar23[8] = puVar23[8] + 1;
    }
  }
  return;
code_r0x0012affb:
  plVar35 = plVar36 + 1;
  plVar36 = plVar36 + 1;
  if (*(uint *)(*plVar35 + 0xc) < *(uint *)(*plVar10 + 0xc)) goto LAB_0012aff6;
LAB_0012b010:
  do {
    if (plVar27 <= plVar10) break;
    plVar35 = plVar27 + -1;
    plVar27 = plVar27 + -1;
  } while (*(uint *)(*plVar10 + 0xc) < *(uint *)(*plVar35 + 0xc));
  if (plVar36 <= plVar27) {
    lVar15 = *plVar36;
    *plVar36 = *plVar27;
    *plVar27 = lVar15;
    goto LAB_0012aff6;
  }
  lVar15 = *plVar10;
  lVar32 = (long)plVar27 - (long)plVar10;
  lVar33 = (long)plVar21 - (long)plVar36;
  plVar35 = plVar36;
  if (lVar33 < lVar32) {
    plVar35 = plVar10;
  }
  *plVar10 = *plVar27;
  plVar30 = plVar21;
  if (lVar33 < lVar32) {
    plVar30 = plVar27;
  }
  *plVar27 = lVar15;
  *(long **)((long)&ZStack_4c8._data + lVar14) = plVar35;
  *(long **)((long)&ZStack_4c8._size + lVar14) = plVar30;
  if (lVar14 < 0x3f1) {
    if (lVar33 < lVar32) {
      plVar10 = plVar36;
      plVar27 = plVar21;
    }
    plVar21 = plVar27;
    lVar14 = lVar14 + 0x10;
    goto LAB_0012af74;
  }
  RAStackAllocator::calculateStackFrame();
LAB_0012b353:
  uVar12 = (uint)plVar21;
  RAStackAllocator::calculateStackFrame();
  pZVar24 = this_00;
LAB_0012b358:
  RAStackAllocator::calculateStackFrame();
LAB_0012b35d:
  RAStackAllocator::calculateStackFrame();
  uVar8 = *(uint *)(pZVar24 + 0x20);
  if ((ulong)uVar8 != 0) {
    lVar14 = *(long *)(pZVar24 + 0x18);
    lVar15 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar14 + lVar15) + 2) & 2) == 0) {
        piVar2 = (int *)(*(long *)(lVar14 + lVar15) + 0x10);
        *piVar2 = *piVar2 + uVar12;
      }
      lVar15 = lVar15 + 8;
    } while ((ulong)uVar8 << 3 != lVar15);
  }
  return;
}

Assistant:

inline void release(ZoneAllocator* allocator) noexcept {
    if (!_data)
      return;
    allocator->release(_data, _capacity / 8);
    reset();
  }